

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.h
# Opt level: O1

int SendRangeRequestSRF02(SRF02 *pSRF02,int device)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((uint)device < 0x10) {
    iVar1 = *(int *)&pSRF02->I2CBus;
    uVar6 = pSRF02->nbretries;
    uVar2 = pSRF02->timeout;
    uVar7 = 0;
    iVar3 = ioctl(iVar1,0x703,(ulong)pSRF02->addr[(uint)device]);
    iVar5 = 1;
    if (iVar3 == 0) {
      ioctl(iVar1,0x704,0);
      ioctl(iVar1,0x708,0);
      ioctl(iVar1,0x701,(ulong)uVar6);
      ioctl(iVar1,0x702,(ulong)uVar2 / 10);
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0x5100;
      iVar1 = *(int *)&pSRF02->I2CBus;
      do {
        sVar4 = write(iVar1,(void *)((long)&local_58 + uVar7),(ulong)(2 - (int)uVar7));
        if ((int)sVar4 < 1) {
          return 1;
        }
        uVar6 = (int)uVar7 + (int)sVar4;
        uVar7 = (ulong)uVar6;
      } while (uVar6 < 2);
      iVar5 = 0;
      if ((pSRF02->bSaveRawData != 0) && ((FILE *)pSRF02->pfSaveFile != (FILE *)0x0)) {
        fwrite(&local_58,2,1,(FILE *)pSRF02->pfSaveFile);
        fflush((FILE *)pSRF02->pfSaveFile);
      }
    }
  }
  else {
    puts("Error reading data from a SRF02 : Invalid parameter. ");
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

inline int SendRangeRequestSRF02(SRF02* pSRF02, int device)
{
	unsigned char sendbuf[MAX_NB_BYTES_SRF02];
	int sendbuflen = 0;

	if ((device < 0)||(device >= MAX_NB_DEVICES_SRF02))
	{
		printf("Error reading data from a SRF02 : Invalid parameter. \n");
		return EXIT_INVALID_PARAMETER;
	}

	if (SetSlaveComputerI2CBus(pSRF02->I2CBus, pSRF02->addr[device], 0, 0, pSRF02->nbretries, pSRF02->timeout) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuf[1] = (unsigned char)REAL_RNG_CM_CMD_SRF02;
	sendbuflen = 2;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	return EXIT_SUCCESS;
}